

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void run_bitset_container_lazy_xor
               (run_container_t *src_1,bitset_container_t *src_2,bitset_container_t *dst)

{
  ushort uVar1;
  int32_t rlepos;
  long lVar2;
  
  if (src_2 != dst) {
    dst->cardinality = src_2->cardinality;
    memcpy(dst->words,src_2->words,0x2000);
  }
  for (lVar2 = 0; lVar2 < src_1->n_runs; lVar2 = lVar2 + 1) {
    uVar1 = src_1->runs[lVar2].value;
    bitset_flip_range(dst->words,(uint)uVar1,(uint)uVar1 + (uint)src_1->runs[lVar2].length + 1);
  }
  dst->cardinality = -1;
  return;
}

Assistant:

void run_bitset_container_lazy_xor(const run_container_t *src_1,
                                   const bitset_container_t *src_2,
                                   bitset_container_t *dst) {
    if (src_2 != dst) bitset_container_copy(src_2, dst);
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        bitset_flip_range(dst->words, rle.value,
                          rle.value + rle.length + UINT32_C(1));
    }
    dst->cardinality = BITSET_UNKNOWN_CARDINALITY;
}